

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_lite.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::AnyMetadata::InternalPackFrom
          (AnyMetadata *this,MessageLite *message,StringPiece type_url_prefix,StringPiece type_name)

{
  ArenaStringPtr *this_00;
  string *output;
  char *pcVar1;
  StringPiece message_name;
  StringPiece type_url_prefix_00;
  string local_50;
  
  this_00 = this->type_url_;
  pcVar1 = (char *)type_name.length_;
  InitProtobufDefaults();
  message_name.length_ = (stringpiece_ssize_type)type_url_prefix.ptr_;
  message_name.ptr_ = (char *)type_name.length_;
  type_url_prefix_00.length_ = (stringpiece_ssize_type)pcVar1;
  type_url_prefix_00.ptr_ = (char *)type_url_prefix.length_;
  GetTypeUrl_abi_cxx11_(&local_50,(internal *)type_name.ptr_,message_name,type_url_prefix_00);
  ArenaStringPtr::SetNoArena(this_00,(string *)fixed_address_empty_string_abi_cxx11_,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  output = ArenaStringPtr::MutableNoArena
                     (this->value_,(string *)fixed_address_empty_string_abi_cxx11_);
  MessageLite::SerializeToString(message,output);
  return;
}

Assistant:

void AnyMetadata::InternalPackFrom(const MessageLite& message,
                                   StringPiece type_url_prefix,
                                   StringPiece type_name) {
  type_url_->SetNoArena(&::google::protobuf::internal::GetEmptyString(),
                        GetTypeUrl(type_name, type_url_prefix));
  message.SerializeToString(value_->MutableNoArena(
      &::google::protobuf::internal::GetEmptyStringAlreadyInited()));
}